

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

consume_operation * __thiscall
density::
conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
::try_start_consume(consume_operation *__return_storage_ptr__,
                   conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
                   *this)

{
  bool bVar1;
  undefined1 local_38 [8];
  consume_operation consume;
  unique_lock<std::mutex> lock;
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
  *this_local;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&consume.m_control,&this->m_mutex);
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
  ::try_start_consume((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
                       *)local_38);
  bVar1 = density::heter_queue::consume_operation::operator_cast_to_bool
                    ((consume_operation *)local_38);
  if (!bVar1) {
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&consume.m_control);
  }
  consume_operation::consume_operation
            (__return_storage_ptr__,0,(unique_lock<std::mutex> *)&consume.m_control,
             (consume_operation *)local_38);
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::~consume_operation((consume_operation *)local_38);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&consume.m_control);
  return __return_storage_ptr__;
}

Assistant:

consume_operation try_start_consume() noexcept
        {
            std::unique_lock<std::mutex> lock(m_mutex);
            auto                         consume = m_queue.try_start_consume();
            if (!consume)
                lock.unlock();
            return consume_operation(PrivateType(), std::move(lock), std::move(consume));
        }